

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxClone.cpp
# Opt level: O1

int slang::syntax::deep::clone(__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  SyntaxNode *args;
  ArrayOrRandomizeMethodExpressionSyntax *pAVar1;
  DeepCloneVisitor visitor_1;
  DeepCloneVisitor visitor_2;
  DeepCloneVisitor visitor;
  ParenExpressionListSyntax *local_40;
  ConstraintBlockSyntax *local_38;
  Token local_30;
  
  args = detail::
         visitSyntaxNode<slang::syntax::SyntaxNode_const,slang::syntax::DeepCloneVisitor,slang::BumpAllocator&>
                   (*(SyntaxNode **)(__fn + 0x18),(DeepCloneVisitor *)&local_30,
                    (BumpAllocator *)__child_stack);
  local_30 = parsing::Token::deepClone((Token *)(__fn + 0x20),(BumpAllocator *)__child_stack);
  if (*(SyntaxNode **)(__fn + 0x30) == (SyntaxNode *)0x0) {
    local_40 = (ParenExpressionListSyntax *)0x0;
  }
  else {
    local_40 = (ParenExpressionListSyntax *)
               detail::
               visitSyntaxNode<slang::syntax::SyntaxNode_const,slang::syntax::DeepCloneVisitor,slang::BumpAllocator&>
                         (*(SyntaxNode **)(__fn + 0x30),(DeepCloneVisitor *)&local_40,
                          (BumpAllocator *)__child_stack);
  }
  if (*(SyntaxNode **)(__fn + 0x38) == (SyntaxNode *)0x0) {
    local_38 = (ConstraintBlockSyntax *)0x0;
  }
  else {
    local_38 = (ConstraintBlockSyntax *)
               detail::
               visitSyntaxNode<slang::syntax::SyntaxNode_const,slang::syntax::DeepCloneVisitor,slang::BumpAllocator&>
                         (*(SyntaxNode **)(__fn + 0x38),(DeepCloneVisitor *)&local_38,
                          (BumpAllocator *)__child_stack);
  }
  pAVar1 = BumpAllocator::
           emplace<slang::syntax::ArrayOrRandomizeMethodExpressionSyntax,slang::syntax::ExpressionSyntax&,slang::parsing::Token,slang::syntax::ParenExpressionListSyntax*,slang::syntax::ConstraintBlockSyntax*>
                     ((BumpAllocator *)__child_stack,(ExpressionSyntax *)args,&local_30,&local_40,
                      &local_38);
  return (int)pAVar1;
}

Assistant:

static SyntaxNode* clone(const ArrayOrRandomizeMethodExpressionSyntax& node, BumpAllocator& alloc) {
    return alloc.emplace<ArrayOrRandomizeMethodExpressionSyntax>(
        *deepClone<ExpressionSyntax>(*node.method, alloc),
        node.with.deepClone(alloc),
        node.args ? deepClone(*node.args, alloc) : nullptr,
        node.constraints ? deepClone(*node.constraints, alloc) : nullptr
    );
}